

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

void normal_updatePosition(ENCODING *enc,char *ptr,char *end,POSITION *pos)

{
  byte *pbVar1;
  POSITION *pos_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  end_local = ptr;
  while (0 < (long)end - (long)end_local) {
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
    case 5:
      end_local = end_local + 2;
      pos->columnNumber = pos->columnNumber + 1;
      break;
    case 6:
      end_local = end_local + 3;
      pos->columnNumber = pos->columnNumber + 1;
      break;
    case 7:
      end_local = end_local + 4;
      pos->columnNumber = pos->columnNumber + 1;
      break;
    default:
      end_local = end_local + 1;
      pos->columnNumber = pos->columnNumber + 1;
      break;
    case 9:
      pos->lineNumber = pos->lineNumber + 1;
      pbVar1 = (byte *)(end_local + 1);
      if ((0 < (long)end - (long)pbVar1) &&
         (*(char *)((long)enc[1].scanners + (ulong)*pbVar1) == '\n')) {
        pbVar1 = (byte *)(end_local + 2);
      }
      end_local = (char *)pbVar1;
      pos->columnNumber = 0;
      break;
    case 10:
      pos->columnNumber = 0;
      pos->lineNumber = pos->lineNumber + 1;
      end_local = end_local + 1;
    }
  }
  return;
}

Assistant:

static void PTRCALL
PREFIX(updatePosition)(const ENCODING *enc, const char *ptr, const char *end,
                       POSITION *pos) {
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    pos->columnNumber++;                                                       \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_LF:
      pos->columnNumber = 0;
      pos->lineNumber++;
      ptr += MINBPC(enc);
      break;
    case BT_CR:
      pos->lineNumber++;
      ptr += MINBPC(enc);
      if (HAS_CHAR(enc, ptr, end) && BYTE_TYPE(enc, ptr) == BT_LF)
        ptr += MINBPC(enc);
      pos->columnNumber = 0;
      break;
    default:
      ptr += MINBPC(enc);
      pos->columnNumber++;
      break;
    }
  }
}